

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O2

int Rnm_ManSensitize(Rnm_Man_t *p)

{
  Gia_Man_t *pGVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Rnm_Obj_t RVar5;
  Abc_Cex_t *pAVar6;
  Gia_Obj_t *pGVar7;
  Rnm_Obj_t *pRVar8;
  Rnm_Obj_t *pRVar9;
  ulong uVar10;
  Rnm_Obj_t *pRVar11;
  Rnm_Obj_t RVar12;
  int iVar13;
  uint uVar14;
  Rnm_Obj_t RVar15;
  Gia_Obj_t *in_RSI;
  int f;
  int iVar16;
  
  pAVar6 = p->pCex;
  iVar13 = pAVar6->nRegs;
  f = 0;
  do {
    if (pAVar6->iFrame < f) {
      if (iVar13 == pAVar6->nBits) {
        pGVar7 = Gia_ManPo(p->pGia,(int)in_RSI);
        pRVar8 = Rnm_ManObj(p,pGVar7,p->pCex->iFrame);
        RVar12 = *pRVar8;
        if (((uint)RVar12 & 1) == 0) {
          puts("Output value is incorrect.");
          RVar12 = *pRVar8;
        }
        return (uint)RVar12 >> 4 & 0xffffff;
      }
      __assert_fail("iBit == p->pCex->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                    ,0x1c3,"int Rnm_ManSensitize(Rnm_Man_t *)");
    }
    for (iVar16 = 0; iVar16 < p->vMap->nSize; iVar16 = iVar16 + 1) {
      pGVar1 = p->pGia;
      uVar2 = Vec_IntEntry(p->vMap,iVar16);
      in_RSI = (Gia_Obj_t *)(ulong)uVar2;
      pGVar7 = Gia_ManObj(pGVar1,uVar2);
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      uVar2 = (uint)*(undefined8 *)pGVar7;
      if (((~uVar2 & 0x9fffffff) != 0) && (((int)uVar2 < 0 || ((uVar2 & 0x1fffffff) == 0x1fffffff)))
         ) {
        __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                      ,0x196,"int Rnm_ManSensitize(Rnm_Man_t *)");
      }
      pRVar8 = Rnm_ManObj(p,pGVar7,f);
      *pRVar8 = (Rnm_Obj_t)
                ((uint)*pRVar8 & 0xfffffffe |
                (uint)(((uint)(&p->pCex[1].iPo)[iVar16 + iVar13 >> 5] >> (iVar16 + iVar13 & 0x1fU) &
                       1) != 0));
      in_RSI = pGVar7;
      iVar3 = Gia_ObjIsPi(p->pGia,pGVar7);
      if (iVar3 == 0) {
        if (pGVar7->Value == 0) {
          __assert_fail("pObj->Value > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                        ,0x19b,"int Rnm_ManSensitize(Rnm_Man_t *)");
        }
        *pRVar8 = (Rnm_Obj_t)((pGVar7->Value & 0xffffff) * 0x10 + ((uint)*pRVar8 & 0xf0000007) + 8);
      }
    }
    for (iVar16 = 0; iVar16 < p->vObjs->nSize; iVar16 = iVar16 + 1) {
      pGVar1 = p->pGia;
      uVar2 = Vec_IntEntry(p->vObjs,iVar16);
      in_RSI = (Gia_Obj_t *)(ulong)uVar2;
      pGVar7 = Gia_ManObj(pGVar1,uVar2);
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      iVar3 = Gia_ObjIsRo(p->pGia,pGVar7);
      if ((iVar3 == 0) && ((~*(uint *)pGVar7 & 0x1fffffff) == 0)) {
        __assert_fail("Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                      ,0x1a2,"int Rnm_ManSensitize(Rnm_Man_t *)");
      }
      pRVar8 = Rnm_ManObj(p,pGVar7,f);
      if (((uint)*pRVar8 & 8) != 0) {
        __assert_fail("!pRnm->fPPi",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                      ,0x1a4,"int Rnm_ManSensitize(Rnm_Man_t *)");
      }
      in_RSI = pGVar7;
      iVar3 = Gia_ObjIsRo(p->pGia,pGVar7);
      if (iVar3 == 0) {
        iVar3 = (int)*(ulong *)pGVar7;
        uVar10 = *(ulong *)pGVar7 & 0x1fffffff;
        if (uVar10 != 0x1fffffff && iVar3 < 0) {
          in_RSI = pGVar7 + -uVar10;
          pRVar9 = Rnm_ManObj(p,in_RSI,f);
          RVar15 = *pRVar8;
          RVar12 = (Rnm_Obj_t)(*(uint *)pGVar7 >> 0x1d ^ (uint)*pRVar9);
          goto LAB_004928ad;
        }
        if ((iVar3 < 0) || ((int)uVar10 == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                        ,0x1b5,"int Rnm_ManSensitize(Rnm_Man_t *)");
        }
        pRVar9 = Rnm_ManObj(p,pGVar7 + -uVar10,f);
        pRVar11 = Rnm_ManObj(p,pGVar7 + -(ulong)(*(uint *)&pGVar7->field_0x4 & 0x1fffffff),f);
        RVar12 = *pRVar8;
        uVar2 = ((uint)(*(ulong *)pGVar7 >> 0x3d) ^ (uint)*pRVar11) &
                ((uint)(*(ulong *)pGVar7 >> 0x1d) & 7 ^ (uint)*pRVar9) & 1;
        *pRVar8 = (Rnm_Obj_t)((uint)RVar12 & 0xfffffffe | uVar2);
        RVar15 = *pRVar9;
        if (uVar2 != 0) {
          uVar14 = (uint)RVar15 >> 4 & 0xffffff;
          in_RSI = (Gia_Obj_t *)(ulong)uVar14;
          uVar4 = (uint)*pRVar11 >> 4 & 0xffffff;
          if (uVar4 < uVar14) {
            uVar4 = uVar14;
          }
          RVar12 = (Rnm_Obj_t)((uint)RVar12 & 0xf000000e | uVar2 | uVar4 << 4);
          goto LAB_004928c7;
        }
        RVar5 = *pRVar11;
        if ((((uint)(*(ulong *)pGVar7 >> 0x1d) & 7 ^ (uint)RVar15) & 1) == 0) {
          if ((((uint)(*(ulong *)pGVar7 >> 0x3d) ^ (uint)RVar5) & 1) == 0) {
            RVar15 = (Rnm_Obj_t)((uint)RVar15 >> 4 & 0xffffff);
            RVar5 = (Rnm_Obj_t)((uint)RVar5 >> 4 & 0xffffff);
            if ((uint)RVar15 < (uint)RVar5) {
              RVar5 = RVar15;
            }
            uVar2 = (int)RVar5 << 4;
            goto LAB_004929b5;
          }
          RVar15 = (Rnm_Obj_t)((uint)RVar15 & 0xffffff0);
          RVar12 = (Rnm_Obj_t)((uint)RVar12 & 0xf000000e | (uint)RVar15);
        }
        else {
          uVar2 = (uint)RVar5 & 0xffffff0;
LAB_004929b5:
          RVar12 = (Rnm_Obj_t)((uint)RVar12 & 0xf000000e | uVar2);
        }
        in_RSI = (Gia_Obj_t *)(ulong)(uint)RVar15;
LAB_004928c7:
        *pRVar8 = RVar12;
      }
      else if (f != 0) {
        in_RSI = Gia_ObjRoToRi(p->pGia,pGVar7);
        pRVar9 = Rnm_ManObj(p,in_RSI,f + -1);
        RVar12 = *pRVar9;
        RVar15 = *pRVar8;
LAB_004928ad:
        *pRVar8 = (Rnm_Obj_t)((uint)RVar15 & 0xfffffffe | (uint)RVar12 & 1);
        RVar12 = (Rnm_Obj_t)
                 ((uint)RVar15 & 0xf000000e | (uint)RVar12 & 1 | (uint)*pRVar9 & 0xffffff0);
        goto LAB_004928c7;
      }
    }
    f = f + 1;
    pAVar6 = p->pCex;
    iVar13 = iVar13 + pAVar6->nPis;
  } while( true );
}

Assistant:

int Rnm_ManSensitize( Rnm_Man_t * p )
{
    Rnm_Obj_t * pRnm, * pRnm0, * pRnm1;
    Gia_Obj_t * pObj;
    int f, i, iBit = p->pCex->nRegs;
    // const0 is initialized automatically in all timeframes
    for ( f = 0; f <= p->pCex->iFrame; f++, iBit += p->pCex->nPis )
    {
        Gia_ManForEachObjVec( p->vMap, p->pGia, pObj, i )
        {
            assert( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) );
            pRnm = Rnm_ManObj( p, pObj, f );
            pRnm->Value = Abc_InfoHasBit( p->pCex->pData, iBit + i );
            if ( !Gia_ObjIsPi(p->pGia, pObj) ) // this is PPI
            {
                assert( pObj->Value > 0 );
                pRnm->Prio = pObj->Value;
                pRnm->fPPi = 1;
            }
        }
        Gia_ManForEachObjVec( p->vObjs, p->pGia, pObj, i )
        {
            assert( Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) );
            pRnm = Rnm_ManObj( p, pObj, f );
            assert( !pRnm->fPPi );
            if ( Gia_ObjIsRo(p->pGia, pObj) )
            {
                if ( f == 0 )
                    continue;
                pRnm0 = Rnm_ManObj( p, Gia_ObjRoToRi(p->pGia, pObj), f-1 );
                pRnm->Value = pRnm0->Value;
                pRnm->Prio  = pRnm0->Prio;
                continue;
            }
            if ( Gia_ObjIsCo(pObj) )
            {
                pRnm0 = Rnm_ManObj( p, Gia_ObjFanin0(pObj), f );
                pRnm->Value = (pRnm0->Value ^ Gia_ObjFaninC0(pObj));
                pRnm->Prio  = pRnm0->Prio;
                continue;
            }
            assert( Gia_ObjIsAnd(pObj) );
            pRnm0 = Rnm_ManObj( p, Gia_ObjFanin0(pObj), f );
            pRnm1 = Rnm_ManObj( p, Gia_ObjFanin1(pObj), f );
            pRnm->Value = (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) & (pRnm1->Value ^ Gia_ObjFaninC1(pObj));
            if ( pRnm->Value == 1 )
                pRnm->Prio  = Abc_MaxInt( pRnm0->Prio, pRnm1->Prio );
            else if ( (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) == 0 && (pRnm1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
                pRnm->Prio  = Abc_MinInt( pRnm0->Prio, pRnm1->Prio ); // choice
            else if ( (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) == 0 )
                pRnm->Prio  = pRnm0->Prio;
            else 
                pRnm->Prio  = pRnm1->Prio;
        }
    }
    assert( iBit == p->pCex->nBits );
    pRnm = Rnm_ManObj( p, Gia_ManPo(p->pGia, 0), p->pCex->iFrame );
    if ( pRnm->Value != 1 )
        printf( "Output value is incorrect.\n" );
    return pRnm->Prio;
}